

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * jx9_context_realloc_chunk(jx9_context *pCtx,void *pChunk,uint nByte)

{
  void *pvVar1;
  jx9_aux_data *pjVar2;
  void *pNew;
  jx9_aux_data *pAux;
  uint nByte_local;
  void *pChunk_local;
  jx9_context *pCtx_local;
  
  pvVar1 = SyMemBackendRealloc(&pCtx->pVm->sAllocator,pChunk,nByte);
  if ((pvVar1 != (void *)0x0) &&
     (pjVar2 = ContextFindChunk(pCtx,pChunk), pjVar2 != (jx9_aux_data *)0x0)) {
    pjVar2->pAuxData = pvVar1;
  }
  return pvVar1;
}

Assistant:

JX9_PRIVATE void * jx9_context_realloc_chunk(jx9_context *pCtx, void *pChunk, unsigned int nByte)
{
	jx9_aux_data *pAux;
	void *pNew;
	pNew = SyMemBackendRealloc(&pCtx->pVm->sAllocator, pChunk, nByte);
	if( pNew ){
		pAux = ContextFindChunk(pCtx, pChunk);
		if( pAux ){
			pAux->pAuxData = pNew;
		}
	}
	return pNew;
}